

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::FunctionEncoding::printLeft(FunctionEncoding *this,OutputStream *S)

{
  Node *pNVar1;
  bool bVar2;
  StringView R;
  
  pNVar1 = this->Ret;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    bVar2 = Node::hasRHSComponent(this->Ret,S);
    if (!bVar2) {
      R.Last = "";
      R.First = " ";
      OutputStream::operator+=(S,R);
    }
  }
  Node::print(this->Name,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ret) {
      Ret->printLeft(S);
      if (!Ret->hasRHSComponent(S))
        S += " ";
    }
    Name->print(S);
  }